

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionResponsePdu.cpp
# Opt level: O2

bool __thiscall DIS::ActionResponsePdu::operator==(ActionResponsePdu *this,ActionResponsePdu *rhs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pFVar5;
  pointer pVVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined7 extraout_var;
  undefined4 uVar10;
  size_t idx;
  ulong uVar11;
  size_t idx_1;
  long lVar12;
  undefined1 auVar13 [16];
  
  bVar7 = SimulationManagementFamilyPdu::operator==
                    (&this->super_SimulationManagementFamilyPdu,
                     &rhs->super_SimulationManagementFamilyPdu);
  bVar8 = EntityID::operator==(&this->_originatingID,&rhs->_originatingID);
  bVar9 = EntityID::operator==(&this->_receivingID,&rhs->_receivingID);
  uVar1 = this->_requestID;
  uVar3 = this->_requestStatus;
  uVar2 = rhs->_requestID;
  uVar4 = rhs->_requestStatus;
  auVar13._4_4_ = -(uint)(uVar2 == uVar1);
  auVar13._0_4_ = -(uint)(uVar2 == uVar1);
  auVar13._8_4_ = -(uint)(uVar4 == uVar3);
  auVar13._12_4_ = -(uint)(uVar4 == uVar3);
  uVar10 = movmskpd((int)CONCAT71(extraout_var,bVar7),auVar13);
  bVar7 = (bool)((byte)uVar10 >> 1 & (bVar9 && (bVar8 && bVar7)) & (byte)uVar10);
  lVar12 = 0;
  for (uVar11 = 0;
      pFVar5 = (this->_fixedDatums).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(this->_fixedDatums).
                             super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pFVar5 >> 4);
      uVar11 = uVar11 + 1) {
    bVar8 = FixedDatum::operator==
                      ((FixedDatum *)((long)&pFVar5->_vptr_FixedDatum + lVar12),
                       (FixedDatum *)
                       ((long)&((rhs->_fixedDatums).
                                super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_FixedDatum +
                       lVar12));
    bVar7 = (bool)(bVar7 & bVar8);
    lVar12 = lVar12 + 0x10;
  }
  lVar12 = 0;
  for (uVar11 = 0;
      pVVar6 = (this->_variableDatums).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar11 < (ulong)(((long)(this->_variableDatums).
                              super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6) / 0x30);
      uVar11 = uVar11 + 1) {
    bVar8 = VariableDatum::operator==
                      ((VariableDatum *)((long)&pVVar6->_vptr_VariableDatum + lVar12),
                       (VariableDatum *)
                       ((long)&((rhs->_variableDatums).
                                super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                       lVar12));
    bVar7 = (bool)(bVar7 & bVar8);
    lVar12 = lVar12 + 0x30;
  }
  return bVar7;
}

Assistant:

bool ActionResponsePdu::operator ==(const ActionResponsePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

     if( ! (_originatingID == rhs._originatingID) ) ivarsEqual = false;
     if( ! (_receivingID == rhs._receivingID) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;
     if( ! (_requestStatus == rhs._requestStatus) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _fixedDatums.size(); idx++)
     {
        if( ! ( _fixedDatums[idx] == rhs._fixedDatums[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatums.size(); idx++)
     {
        if( ! ( _variableDatums[idx] == rhs._variableDatums[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }